

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O3

int __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
::compute_reduced_costs<baryonyx::bit_array>
          (solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
           *this,row_iterator begin,row_iterator end,bit_array *x)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  rc_data *x_00;
  _Head_base<0UL,_int_*,_false> _Var4;
  long lVar5;
  long lVar6;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar7;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar8;
  longdouble in_ST5;
  longdouble in_ST6;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  if (begin == end) {
    lVar6 = 0;
  }
  else {
    lVar5 = 0;
    do {
      sparse_matrix<int>::column((sparse_matrix<int> *)&local_40,(int)this + 0x10);
      piVar3 = (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
               super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl;
      lVar7 = (longdouble)0;
      lVar8 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = in_ST6;
      if ((tuple<int_*,_std::default_delete<int[]>_>)local_38._M_head_impl !=
          (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
          local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl) {
        lVar7 = (longdouble)0;
        _Var4._M_head_impl = local_38._M_head_impl;
        do {
          iVar2 = *_Var4._M_head_impl;
          piVar1 = _Var4._M_head_impl + 4;
          _Var4._M_head_impl = _Var4._M_head_impl + 8;
          lVar7 = ((this->P)._M_t.
                   super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                   super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                   super__Head_base<0UL,_long_double_*,_false>._M_head_impl[iVar2] +
                  (this->pi)._M_t.
                  super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                  super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                  super__Head_base<0UL,_long_double_*,_false>._M_head_impl[*piVar1]) *
                  ABS((longdouble)piVar3[iVar2]) + lVar7;
          lVar8 = in_ST3;
          in_ST4 = in_ST3;
          in_ST5 = in_ST3;
        } while ((tuple<int_*,_std::default_delete<int[]>_>)_Var4._M_head_impl !=
                 (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
                 local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl);
      }
      x_00 = (this->R)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_false>
             ._M_head_impl;
      x_00[lVar5].id = (int)lVar5;
      *(int *)((long)(x_00 + lVar5) + 0x14) = piVar3[begin->value];
      quadratic_cost_type<long_double>::operator()
                ((longdouble *)this->c,
                 (quadratic_cost_type<long_double> *)(ulong)(uint)begin->column,(int)x,
                 (bit_array *)x_00);
      lVar6 = lVar5 + 1;
      begin = begin + 1;
      (this->R)._M_t.
      super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
      .
      super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_false>
      ._M_head_impl[lVar5].value = in_ST0 - lVar7;
      lVar5 = lVar6;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = lVar8;
      in_ST6 = in_ST5;
    } while (begin != end);
  }
  return (int)lVar6;
}

Assistant:

int compute_reduced_costs(sparse_matrix<int>::row_iterator begin,
                              sparse_matrix<int>::row_iterator end,
                              const Xtype& x) noexcept
    {
        // to_log(
        //  debug_os, "  compute-reduced-cost {}\n", std::distance(begin,
        //  end));

        int r_size = 0;

        for (; begin != end; ++begin) {
            Float sum_a_pi_p = 0;

            for (auto [first, last] = ap.column(begin->column); first != last;
                 ++first) {
                auto a = std::abs(static_cast<Float>(A[first->value]));
                sum_a_pi_p += a * (pi[first->row] + P[first->value]);
            }

            R[r_size].id = r_size;
            R[r_size].f = A[begin->value];
            R[r_size].value = c(begin->column, x) - sum_a_pi_p;

            // to_log(debug_os,
            //       4u,
            //       "Compute: {} = {} - {} - {}\n",
            //       r_size,
            //       c(begin->column, x),
            //       sum_pi,
            //       sum_p);

            // to_log(debug_os, 4u, "{}x{}\n", R[r_size].f, R[r_size].value);

            ++r_size;
        }

        // to_log(debug_os, "\n");

        return r_size;
    }